

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metamakefile.cpp
# Opt level: O2

void __thiscall
BuildsMetaMakefileGenerator::accumulateVariableFromBuilds
          (BuildsMetaMakefileGenerator *this,ProKey *name,Build *dst)

{
  Build **ppBVar1;
  long lVar2;
  Build *pBVar3;
  QMakeProject *pQVar4;
  QList<ProString> *this_00;
  QList<ProString> *l;
  long lVar5;
  
  pQVar4 = MakefileGenerator::projectFile(dst->makefile);
  this_00 = &QMakeEvaluator::valuesRef(&pQVar4->super_QMakeEvaluator,name)->super_QList<ProString>;
  ppBVar1 = (this->makefiles).d.ptr;
  lVar2 = (this->makefiles).d.size;
  for (lVar5 = 0; lVar2 << 3 != lVar5; lVar5 = lVar5 + 8) {
    pBVar3 = *(Build **)((long)ppBVar1 + lVar5);
    if (pBVar3 != dst) {
      pQVar4 = MakefileGenerator::projectFile(pBVar3->makefile);
      l = &QMakeEvaluator::valuesRef(&pQVar4->super_QMakeEvaluator,name)->super_QList<ProString>;
      QList<ProString>::append(this_00,l);
    }
  }
  ProStringList::removeDuplicates((ProStringList *)this_00);
  return;
}

Assistant:

void BuildsMetaMakefileGenerator::accumulateVariableFromBuilds(const ProKey &name, Build *dst) const
{
    ProStringList &values = dst->makefile->projectFile()->values(name);
    for (auto build : makefiles) {
        if (build != dst)
            values += build->makefile->projectFile()->values(name);
    }
    values.removeDuplicates();
}